

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall testing::TestPartResultArray::~TestPartResultArray(TestPartResultArray *this)

{
  vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *in_stack_00000010;
  
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (in_stack_00000010);
  return;
}

Assistant:

class GTEST_API_ TestPartResultArray {
 public:
  TestPartResultArray() {}

  // Appends the given TestPartResult to the array.
  void Append(const TestPartResult& result);

  // Returns the TestPartResult at the given index (0-based).
  const TestPartResult& GetTestPartResult(int index) const;

  // Returns the number of TestPartResult objects in the array.
  int size() const;

 private:
  std::vector<TestPartResult> array_;

  GTEST_DISALLOW_COPY_AND_ASSIGN_(TestPartResultArray);
}